

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,string *newFlags)

{
  byte bVar1;
  string *newFlags_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::__cxx11::string::empty();
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)flags," ");
    }
    std::__cxx11::string::operator+=((string *)flags,(string *)newFlags);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags,
                                   const std::string& newFlags) const
{
  if (!newFlags.empty()) {
    if (!flags.empty()) {
      flags += " ";
    }
    flags += newFlags;
  }
}